

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm1d.c
# Opt level: O3

void av1_fdct4(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int iVar1;
  long lVar2;
  undefined7 in_register_00000011;
  long lVar3;
  long lVar4;
  int iVar5;
  int32_t step [4];
  int32_t local_38;
  int32_t local_34;
  int32_t local_30;
  undefined4 local_2c;
  
  av1_range_check_buf(0,input,input,4,*stage_range);
  *output = input[3] + *input;
  output[1] = input[2] + input[1];
  output[2] = input[1] - input[2];
  output[3] = *input - input[3];
  av1_range_check_buf(1,input,output,4,stage_range[1]);
  lVar3 = (long)(int)CONCAT71(in_register_00000011,cos_bit) * 0x100;
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar3 + 0x1e0);
  lVar2 = 1L << (cos_bit - 1U & 0x3f);
  iVar5 = output[1] * iVar1;
  lVar4 = (long)*output * (long)iVar1 + lVar2;
  local_38 = (int32_t)(lVar4 + iVar5 >> (cos_bit & 0x3fU));
  local_34 = (int32_t)(-iVar5 + lVar4 >> (cos_bit & 0x3fU));
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar3 + 0x1a0);
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar3 + 0x220);
  local_30 = (int32_t)(output[2] * iVar5 + lVar2 + (long)(output[3] * iVar1) >> (cos_bit & 0x3fU));
  local_2c = (undefined4)
             (output[3] * iVar5 + lVar2 + (long)-(output[2] * iVar1) >> (cos_bit & 0x3fU));
  av1_range_check_buf(2,input,&local_38,4,stage_range[2]);
  *output = local_38;
  output[1] = local_30;
  output[2] = local_34;
  output[3] = local_34;
  av1_range_check_buf(3,input,output,4,stage_range[3]);
  return;
}

Assistant:

void av1_fdct4(const int32_t *input, int32_t *output, int8_t cos_bit,
               const int8_t *stage_range) {
  const int32_t size = 4;
  const int32_t *cospi;

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[4];

  // stage 0;
  av1_range_check_buf(stage, input, input, size, stage_range[stage]);

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[0] + input[3];
  bf1[1] = input[1] + input[2];
  bf1[2] = -input[2] + input[1];
  bf1[3] = -input[3] + input[0];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[32], bf0[0], cospi[32], bf0[1], cos_bit);
  bf1[1] = half_btf(-cospi[32], bf0[1], cospi[32], bf0[0], cos_bit);
  bf1[2] = half_btf(cospi[48], bf0[2], cospi[16], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[48], bf0[3], -cospi[16], bf0[2], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0];
  bf1[1] = bf0[2];
  bf1[2] = bf0[1];
  bf1[3] = bf0[3];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);
}